

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Track::GetFirst(Track *this,BlockEntry **pBlockEntry)

{
  bool bVar1;
  uint uVar2;
  BlockEntry *pBVar3;
  long *in_RSI;
  Track *in_RDI;
  BlockEntry *pNextEntry;
  longlong tn;
  Block *pBlock;
  long status;
  int i;
  Cluster *pCluster;
  Cluster *in_stack_00000090;
  Segment *in_stack_00000098;
  long local_48;
  BlockEntry **in_stack_ffffffffffffffc0;
  Segment *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar4;
  Cluster *local_20;
  
  local_20 = Segment::GetFirst(in_RDI->m_pSegment);
  iVar4 = 0;
  while( true ) {
    if (local_20 == (Cluster *)0x0) {
      pBVar3 = GetEOS(in_RDI);
      *in_RSI = (long)pBVar3;
      return 1;
    }
    bVar1 = Cluster::EOS(local_20);
    if (bVar1) break;
    pBVar3 = (BlockEntry *)
             Cluster::GetFirst((Cluster *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if ((long)pBVar3 < 0) {
      return (long)pBVar3;
    }
    if (*in_RSI == 0) {
      local_20 = Segment::GetNext(in_stack_00000098,in_stack_00000090);
    }
    else {
      while( true ) {
        in_stack_ffffffffffffffc8 = (Segment *)(**(code **)(*(long *)*in_RSI + 0x10))();
        in_stack_ffffffffffffffc0 =
             (BlockEntry **)Block::GetTrackNumber((Block *)in_stack_ffffffffffffffc8);
        if ((in_stack_ffffffffffffffc0 == (BlockEntry **)(in_RDI->m_info).number) &&
           (uVar2 = (*in_RDI->_vptr_Track[2])(in_RDI,*in_RSI), (uVar2 & 1) != 0)) {
          return 0;
        }
        pBVar3 = (BlockEntry *)
                 Cluster::GetNext((Cluster *)CONCAT44(iVar4,in_stack_ffffffffffffffd8),pBVar3,
                                  (BlockEntry **)in_stack_ffffffffffffffc8);
        if ((long)pBVar3 < 0) {
          return (long)pBVar3;
        }
        if (local_48 == 0) break;
        *in_RSI = local_48;
      }
      iVar4 = iVar4 + 1;
      if (99 < iVar4) {
        pBVar3 = GetEOS(in_RDI);
        *in_RSI = (long)pBVar3;
        return 1;
      }
      local_20 = Segment::GetNext(in_stack_00000098,in_stack_00000090);
    }
  }
  bVar1 = Segment::DoneParsing(in_stack_ffffffffffffffc8);
  if (!bVar1) {
    *in_RSI = 0;
    return -3;
  }
  pBVar3 = GetEOS(in_RDI);
  *in_RSI = (long)pBVar3;
  return 1;
}

Assistant:

long Track::GetFirst(const BlockEntry*& pBlockEntry) const {
  const Cluster* pCluster = m_pSegment->GetFirst();

  for (int i = 0;;) {
    if (pCluster == NULL) {
      pBlockEntry = GetEOS();
      return 1;
    }

    if (pCluster->EOS()) {
      if (m_pSegment->DoneParsing()) {
        pBlockEntry = GetEOS();
        return 1;
      }

      pBlockEntry = 0;
      return E_BUFFER_NOT_FULL;
    }

    long status = pCluster->GetFirst(pBlockEntry);

    if (status < 0)  // error
      return status;

    if (pBlockEntry == 0) {  // empty cluster
      pCluster = m_pSegment->GetNext(pCluster);
      continue;
    }

    for (;;) {
      const Block* const pBlock = pBlockEntry->GetBlock();
      assert(pBlock);

      const long long tn = pBlock->GetTrackNumber();

      if ((tn == m_info.number) && VetEntry(pBlockEntry))
        return 0;

      const BlockEntry* pNextEntry;

      status = pCluster->GetNext(pBlockEntry, pNextEntry);

      if (status < 0)  // error
        return status;

      if (pNextEntry == 0)
        break;

      pBlockEntry = pNextEntry;
    }

    ++i;

    if (i >= 100)
      break;

    pCluster = m_pSegment->GetNext(pCluster);
  }

  // NOTE: if we get here, it means that we didn't find a block with
  // a matching track number.  We interpret that as an error (which
  // might be too conservative).

  pBlockEntry = GetEOS();  // so we can return a non-NULL value
  return 1;
}